

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MS3DLoader.cpp
# Opt level: O2

void __thiscall
Assimp::MS3DImporter::InternReadFile
          (MS3DImporter *this,string *pFile,aiScene *pScene,IOSystem *pIOHandler)

{
  pointer pTVar1;
  key_type *__k;
  undefined8 *puVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  pointer pTVar8;
  pointer pTVar9;
  char cVar10;
  unsigned_short uVar11;
  short sVar12;
  unsigned_short uVar13;
  uint i_5;
  int iVar14;
  int iVar15;
  undefined4 extraout_var;
  Logger *pLVar16;
  aiMaterial **ppaVar17;
  aiMaterial *this_00;
  aiMesh **__s;
  aiMesh *this_01;
  ulong *puVar18;
  aiFace *paVar19;
  aiVector3D *paVar20;
  uint *puVar21;
  iterator iVar22;
  mapped_type_conflict2 *pmVar23;
  aiBone **__s_00;
  aiBone *paVar24;
  aiVertexWeight *paVar25;
  _Rb_tree_node_base *p_Var26;
  aiNode *this_02;
  aiNode **ppaVar27;
  aiNode *this_03;
  aiAnimation **ppaVar28;
  aiAnimation *this_04;
  aiNodeAnim **__s_01;
  aiNodeAnim *this_05;
  aiQuatKey *paVar29;
  aiMatrix4x4t<float> *paVar30;
  aiMatrix4x4t<float> *m;
  aiVectorKey *paVar31;
  DeadlyImportError *pDVar32;
  bool bVar33;
  aiFace *paVar34;
  ulong uVar35;
  ulong uVar36;
  aiQuatKey *paVar37;
  uint i_2;
  ulong uVar38;
  pointer pTVar39;
  pointer pTVar40;
  pointer pTVar41;
  long lVar42;
  pointer sz;
  aiColor4D *ambient;
  ulong uVar43;
  uint i;
  long lVar44;
  ulong uVar45;
  pointer pTVar46;
  uint i_1;
  uint uVar47;
  pointer pTVar48;
  float *pInput;
  uint i_3;
  float fVar49;
  float fVar50;
  aiVector3t<float> aVar51;
  long local_9e0;
  long local_9d8;
  long local_9c0;
  vector<Assimp::MS3DImporter::TempJoint,_std::allocator<Assimp::MS3DImporter::TempJoint>_> joints;
  vector<Assimp::MS3DImporter::TempMaterial,_std::allocator<Assimp::MS3DImporter::TempMaterial>_>
  materials;
  StreamReaderLE stream;
  vector<Assimp::MS3DImporter::TempGroup,_std::allocator<Assimp::MS3DImporter::TempGroup>_> groups;
  vector<Assimp::MS3DImporter::TempVertex,_std::allocator<Assimp::MS3DImporter::TempVertex>_>
  vertices;
  aiMatrix4x4t<float> local_8f0;
  vector<Assimp::MS3DImporter::TempTriangle,_std::allocator<Assimp::MS3DImporter::TempTriangle>_>
  triangles;
  char head [10];
  aiMatrix3x3t<float> local_888;
  aiQuaterniont<float> local_858;
  aiString tmp;
  int sm;
  float fStack_434;
  float fStack_430;
  undefined8 uStack_42c;
  undefined4 local_424;
  undefined4 local_420;
  undefined4 uStack_41c;
  undefined8 uStack_418;
  float local_410;
  undefined8 local_40c;
  undefined8 uStack_404;
  float local_3fc;
  
  std::__cxx11::string::string((string *)&tmp,"rb",(allocator *)&sm);
  iVar14 = (*pIOHandler->_vptr_IOSystem[4])(pIOHandler,(pFile->_M_dataplus)._M_p,tmp._0_8_);
  StreamReader<false,_false>::StreamReader(&stream,(IOStream *)CONCAT44(extraout_var,iVar14),false);
  std::__cxx11::string::~string((string *)&tmp);
  this->mScene = pScene;
  StreamReader<false,_false>::CopyAndAdvance(&stream,head,10);
  iVar14 = StreamReader<false,_false>::Get<int>(&stream);
  iVar15 = bcmp(head,"MS3D000000",10);
  if (iVar15 != 0) {
    pDVar32 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&tmp,
                   "Not a MS3D file, magic string MS3D000000 not found: ",pFile);
    DeadlyImportError::DeadlyImportError(pDVar32,(string *)&tmp);
    __cxa_throw(pDVar32,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  if (iVar14 != 4) {
    pDVar32 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string
              ((string *)&tmp,"MS3D: Unsupported file format version, 4 was expected",
               (allocator *)&sm);
    DeadlyImportError::DeadlyImportError(pDVar32,(string *)&tmp);
    __cxa_throw(pDVar32,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  uVar11 = StreamReader<false,_false>::Get<unsigned_short>(&stream);
  uVar43 = (ulong)uVar11;
  std::vector<Assimp::MS3DImporter::TempVertex,_std::allocator<Assimp::MS3DImporter::TempVertex>_>::
  vector(&vertices,uVar43,(allocator_type *)&tmp);
  for (lVar44 = 0;
      pTVar8 = vertices.
               super__Vector_base<Assimp::MS3DImporter::TempVertex,_std::allocator<Assimp::MS3DImporter::TempVertex>_>
               ._M_impl.super__Vector_impl_data._M_start, uVar43 * 0x30 - lVar44 != 0;
      lVar44 = lVar44 + 0x30) {
    StreamReader<false,_false>::IncPtr(&stream,1);
    ReadVector(&stream,(aiVector3D *)((long)pTVar8->bone_id + lVar44 + -0xc));
    cVar10 = StreamReader<false,_false>::Get<signed_char>(&stream);
    *(int *)((long)pTVar8->bone_id + lVar44) = (int)cVar10;
    cVar10 = StreamReader<false,_false>::Get<signed_char>(&stream);
    *(int *)((long)pTVar8->weights + lVar44 + -4) = (int)cVar10;
    *(undefined4 *)((long)pTVar8->bone_id + lVar44 + 0xc) = 0xffffffff;
    *(undefined8 *)((long)pTVar8->bone_id + lVar44 + 4) = 0xffffffffffffffff;
    puVar2 = (undefined8 *)((long)pTVar8->weights + lVar44);
    *puVar2 = 0x3f800000;
    puVar2[1] = 0;
  }
  uVar11 = StreamReader<false,_false>::Get<unsigned_short>(&stream);
  std::
  vector<Assimp::MS3DImporter::TempTriangle,_std::allocator<Assimp::MS3DImporter::TempTriangle>_>::
  vector(&triangles,(ulong)uVar11,(allocator_type *)&tmp);
  local_9d8 = 0x30;
  local_9c0 = 0x34;
  local_9e0 = 0;
  for (uVar45 = 0;
      pTVar9 = triangles.
               super__Vector_base<Assimp::MS3DImporter::TempTriangle,_std::allocator<Assimp::MS3DImporter::TempTriangle>_>
               ._M_impl.super__Vector_impl_data._M_start, uVar45 != uVar11; uVar45 = uVar45 + 1) {
    StreamReader<false,_false>::IncPtr(&stream,2);
    for (lVar44 = 0; lVar44 != 3; lVar44 = lVar44 + 1) {
      sVar12 = StreamReader<false,_false>::Get<short>(&stream);
      *(int *)((long)pTVar9->indices + lVar44 * 4 + local_9e0) = (int)sVar12;
    }
    for (lVar44 = 0xc; lVar44 != 0x30; lVar44 = lVar44 + 0xc) {
      ReadVector(&stream,(aiVector3D *)((long)pTVar9->indices + lVar44 + local_9e0));
    }
    for (lVar44 = 0; lVar44 != 3; lVar44 = lVar44 + 1) {
      fVar49 = StreamReader<false,_false>::Get<float>(&stream);
      *(float *)((long)pTVar9->indices + lVar44 * 8 + local_9d8) = fVar49;
    }
    for (lVar44 = 0; lVar44 != 3; lVar44 = lVar44 + 1) {
      fVar49 = StreamReader<false,_false>::Get<float>(&stream);
      *(float *)((long)pTVar9->indices + lVar44 * 8 + local_9c0) = fVar49;
    }
    cVar10 = StreamReader<false,_false>::Get<signed_char>(&stream);
    pTVar9[uVar45].sg = (int)cVar10;
    cVar10 = StreamReader<false,_false>::Get<signed_char>(&stream);
    pTVar9[uVar45].group = (int)cVar10;
    local_9e0 = local_9e0 + 0x50;
    local_9d8 = local_9d8 + 0x50;
    local_9c0 = local_9c0 + 0x50;
  }
  uVar11 = StreamReader<false,_false>::Get<unsigned_short>(&stream);
  std::vector<Assimp::MS3DImporter::TempGroup,_std::allocator<Assimp::MS3DImporter::TempGroup>_>::
  vector(&groups,(ulong)uVar11,(allocator_type *)&tmp);
  bVar33 = false;
  for (uVar45 = 0; uVar45 != uVar11; uVar45 = uVar45 + 1) {
    pTVar41 = groups.
              super__Vector_base<Assimp::MS3DImporter::TempGroup,_std::allocator<Assimp::MS3DImporter::TempGroup>_>
              ._M_impl.super__Vector_impl_data._M_start + uVar45;
    StreamReader<false,_false>::IncPtr(&stream,1);
    StreamReader<false,_false>::CopyAndAdvance(&stream,pTVar41,0x20);
    pTVar41->name[0x20] = '\0';
    uVar13 = StreamReader<false,_false>::Get<unsigned_short>(&stream);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
              (&pTVar41->triangles,(ulong)uVar13);
    for (uVar38 = 0; uVar13 != uVar38; uVar38 = uVar38 + 1) {
      sVar12 = StreamReader<false,_false>::Get<short>(&stream);
      (pTVar41->triangles).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start[uVar38] = (int)sVar12;
    }
    cVar10 = StreamReader<false,_false>::Get<signed_char>(&stream);
    pTVar41->mat = (int)cVar10;
    bVar33 = (bool)(bVar33 | cVar10 == -1);
  }
  uVar11 = StreamReader<false,_false>::Get<unsigned_short>(&stream);
  std::
  vector<Assimp::MS3DImporter::TempMaterial,_std::allocator<Assimp::MS3DImporter::TempMaterial>_>::
  vector(&materials,(ulong)uVar11,(allocator_type *)&tmp);
  for (lVar44 = 0;
      pTVar48 = materials.
                super__Vector_base<Assimp::MS3DImporter::TempMaterial,_std::allocator<Assimp::MS3DImporter::TempMaterial>_>
                ._M_impl.super__Vector_impl_data._M_start, (ulong)uVar11 * 400 - lVar44 != 0;
      lVar44 = lVar44 + 400) {
    StreamReader<false,_false>::CopyAndAdvance
              (&stream,(materials.
                        super__Vector_base<Assimp::MS3DImporter::TempMaterial,_std::allocator<Assimp::MS3DImporter::TempMaterial>_>
                        ._M_impl.super__Vector_impl_data._M_start)->name + lVar44,0x20);
    ambient = (aiColor4D *)((long)&(pTVar48->ambient).r + lVar44);
    *(undefined1 *)&ambient[-0x13].a = 0;
    ReadColor(&stream,ambient);
    ReadColor(&stream,(aiColor4D *)((long)&(pTVar48->diffuse).r + lVar44));
    ReadColor(&stream,(aiColor4D *)((long)&(pTVar48->specular).r + lVar44));
    ReadColor(&stream,(aiColor4D *)((long)&(pTVar48->emissive).r + lVar44));
    fVar49 = StreamReader<false,_false>::Get<float>(&stream);
    *(float *)((long)&pTVar48->shininess + lVar44) = fVar49;
    fVar49 = StreamReader<false,_false>::Get<float>(&stream);
    *(float *)((long)&pTVar48->transparency + lVar44) = fVar49;
    StreamReader<false,_false>::IncPtr(&stream,1);
    StreamReader<false,_false>::CopyAndAdvance(&stream,pTVar48->texture + lVar44,0x80);
    (pTVar48->alphamap + lVar44)[-1] = '\0';
    StreamReader<false,_false>::CopyAndAdvance(&stream,pTVar48->alphamap + lVar44,0x80);
    pTVar48->alphamap[lVar44 + 0x80] = '\0';
  }
  fVar49 = StreamReader<false,_false>::Get<float>(&stream);
  StreamReader<false,_false>::Get<float>(&stream);
  StreamReader<false,_false>::Get<unsigned_int>(&stream);
  uVar11 = StreamReader<false,_false>::Get<unsigned_short>(&stream);
  std::vector<Assimp::MS3DImporter::TempJoint,_std::allocator<Assimp::MS3DImporter::TempJoint>_>::
  vector(&joints,(ulong)uVar11,(allocator_type *)&tmp);
  local_9d8 = 0x20;
  for (uVar45 = 0; uVar45 != uVar11; uVar45 = uVar45 + 1) {
    pTVar40 = joints.
              super__Vector_base<Assimp::MS3DImporter::TempJoint,_std::allocator<Assimp::MS3DImporter::TempJoint>_>
              ._M_impl.super__Vector_impl_data._M_start + uVar45;
    StreamReader<false,_false>::IncPtr(&stream,1);
    StreamReader<false,_false>::CopyAndAdvance(&stream,pTVar40,0x20);
    pTVar40->name[0x20] = '\0';
    StreamReader<false,_false>::CopyAndAdvance(&stream,pTVar40->parentName,0x20);
    pTVar40->parentName[0x20] = '\0';
    ReadVector(&stream,&pTVar40->rotation);
    ReadVector(&stream,&pTVar40->position);
    sVar12 = StreamReader<false,_false>::Get<short>(&stream);
    std::
    vector<Assimp::MS3DImporter::TempKeyFrame,_std::allocator<Assimp::MS3DImporter::TempKeyFrame>_>
    ::resize(&pTVar40->rotFrames,(long)sVar12);
    sVar12 = StreamReader<false,_false>::Get<short>(&stream);
    std::
    vector<Assimp::MS3DImporter::TempKeyFrame,_std::allocator<Assimp::MS3DImporter::TempKeyFrame>_>
    ::resize(&pTVar40->posFrames,(long)sVar12);
    uVar47 = 0;
    while( true ) {
      pTVar46 = (pTVar40->rotFrames).
                super__Vector_base<Assimp::MS3DImporter::TempKeyFrame,_std::allocator<Assimp::MS3DImporter::TempKeyFrame>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if ((ulong)((long)(pTVar40->rotFrames).
                        super__Vector_base<Assimp::MS3DImporter::TempKeyFrame,_std::allocator<Assimp::MS3DImporter::TempKeyFrame>_>
                        ._M_impl.super__Vector_impl_data._M_finish - (long)pTVar46 >> 4) <=
          (ulong)uVar47) break;
      fVar50 = StreamReader<false,_false>::Get<float>(&stream);
      pTVar46 = pTVar46 + uVar47;
      pTVar46->time = fVar50;
      ReadVector(&stream,&pTVar46->value);
      uVar47 = uVar47 + 1;
    }
    uVar47 = 0;
    while( true ) {
      pTVar46 = (pTVar40->posFrames).
                super__Vector_base<Assimp::MS3DImporter::TempKeyFrame,_std::allocator<Assimp::MS3DImporter::TempKeyFrame>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if ((ulong)((long)(pTVar40->posFrames).
                        super__Vector_base<Assimp::MS3DImporter::TempKeyFrame,_std::allocator<Assimp::MS3DImporter::TempKeyFrame>_>
                        ._M_impl.super__Vector_impl_data._M_finish - (long)pTVar46 >> 4) <=
          (ulong)uVar47) break;
      fVar50 = StreamReader<false,_false>::Get<float>(&stream);
      pTVar46 = pTVar46 + uVar47;
      pTVar46->time = fVar50;
      ReadVector(&stream,&pTVar46->value);
      uVar47 = uVar47 + 1;
    }
  }
  if ((4 < (uint)((int)stream.end - (int)stream.current)) &&
     (uVar47 = StreamReader<false,_false>::Get<unsigned_int>(&stream), uVar47 == 1)) {
    ReadComments<Assimp::MS3DImporter::TempGroup>(this,&stream,&groups);
    ReadComments<Assimp::MS3DImporter::TempMaterial>(this,&stream,&materials);
    ReadComments<Assimp::MS3DImporter::TempJoint>(this,&stream,&joints);
    iVar14 = StreamReader<false,_false>::Get<int>(&stream);
    if (iVar14 != 0) {
      iVar14 = StreamReader<false,_false>::Get<int>(&stream);
      if ((ulong)(uint)((int)stream.end - (int)stream.current) < (ulong)(long)iVar14) {
        pDVar32 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
        std::__cxx11::string::string
                  ((string *)&tmp,"MS3D: Model comment is too long",(allocator *)&sm);
        DeadlyImportError::DeadlyImportError(pDVar32,(string *)&tmp);
        __cxa_throw(pDVar32,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
      }
      sm = (int)((long)&uStack_42c + 4);
      fStack_434 = (float)((ulong)((long)&uStack_42c + 4) >> 0x20);
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&sm,CONCAT44(stream.current._4_4_,(int)stream.current),
                 (long)iVar14 + CONCAT44(stream.current._4_4_,(int)stream.current));
      pLVar16 = DefaultLogger::get();
      Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
      basic_formatter<char[22]>
                ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)&tmp,
                 (char (*) [22])"MS3D: Model comment: ");
      std::operator<<((ostream *)&tmp,(string *)&sm);
      std::__cxx11::stringbuf::str();
      Logger::debug(pLVar16,(char *)CONCAT44(local_8f0.a2,local_8f0.a1));
      std::__cxx11::string::~string((string *)&local_8f0);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&tmp);
      std::__cxx11::string::~string((string *)&sm);
    }
    if ((4 < (uint)((int)stream.end - (int)stream.current)) &&
       (uVar47 = StreamReader<false,_false>::Get<unsigned_int>(&stream), (uVar47 & 0xfffffffe) == 2)
       ) {
      for (uVar45 = 0;
          pTVar8 = vertices.
                   super__Vector_base<Assimp::MS3DImporter::TempVertex,_std::allocator<Assimp::MS3DImporter::TempVertex>_>
                   ._M_impl.super__Vector_impl_data._M_start, uVar45 != uVar43; uVar45 = uVar45 + 1)
      {
        fVar50 = 1.0;
        for (lVar44 = -0xc; pTVar8[uVar45].weights[3] = fVar50, lVar44 != 0; lVar44 = lVar44 + 4) {
          cVar10 = StreamReader<false,_false>::Get<signed_char>(&stream);
          *(int *)((long)pTVar8->bone_id + lVar44 + local_9d8 + -0x10) = (int)cVar10;
          cVar10 = StreamReader<false,_false>::Get<signed_char>(&stream);
          *(float *)((long)pTVar8->bone_id + lVar44 + local_9d8) = (float)(uint)(int)cVar10 / 255.0;
          fVar50 = pTVar8[uVar45].weights[3] - (float)(uint)(int)cVar10 / 255.0;
        }
        StreamReader<false,_false>::IncPtr(&stream,(ulong)(uVar47 * 4 - 4));
        local_9d8 = local_9d8 + 0x30;
      }
    }
  }
  if ((bVar33) &&
     (materials.
      super__Vector_base<Assimp::MS3DImporter::TempMaterial,_std::allocator<Assimp::MS3DImporter::TempMaterial>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      materials.
      super__Vector_base<Assimp::MS3DImporter::TempMaterial,_std::allocator<Assimp::MS3DImporter::TempMaterial>_>
      ._M_impl.super__Vector_impl_data._M_start)) {
    pLVar16 = DefaultLogger::get();
    Logger::warn(pLVar16,"MS3D: Found group with no material assigned, spawning default material");
    memset(&tmp,0,400);
    tmp.data[0x17c] = '\0';
    tmp.data._364_8_ = tmp.data + 0x17c;
    std::
    vector<Assimp::MS3DImporter::TempMaterial,_std::allocator<Assimp::MS3DImporter::TempMaterial>_>
    ::emplace_back<Assimp::MS3DImporter::TempMaterial>(&materials,(TempMaterial *)&tmp);
    std::__cxx11::string::~string((string *)(tmp.data + 0x16c));
    materials.
    super__Vector_base<Assimp::MS3DImporter::TempMaterial,_std::allocator<Assimp::MS3DImporter::TempMaterial>_>
    ._M_impl.super__Vector_impl_data._M_finish[-1].name[0] = '<';
    materials.
    super__Vector_base<Assimp::MS3DImporter::TempMaterial,_std::allocator<Assimp::MS3DImporter::TempMaterial>_>
    ._M_impl.super__Vector_impl_data._M_finish[-1].name[1] = 'M';
    materials.
    super__Vector_base<Assimp::MS3DImporter::TempMaterial,_std::allocator<Assimp::MS3DImporter::TempMaterial>_>
    ._M_impl.super__Vector_impl_data._M_finish[-1].name[2] = 'S';
    materials.
    super__Vector_base<Assimp::MS3DImporter::TempMaterial,_std::allocator<Assimp::MS3DImporter::TempMaterial>_>
    ._M_impl.super__Vector_impl_data._M_finish[-1].name[3] = '3';
    materials.
    super__Vector_base<Assimp::MS3DImporter::TempMaterial,_std::allocator<Assimp::MS3DImporter::TempMaterial>_>
    ._M_impl.super__Vector_impl_data._M_finish[-1].name[4] = 'D';
    materials.
    super__Vector_base<Assimp::MS3DImporter::TempMaterial,_std::allocator<Assimp::MS3DImporter::TempMaterial>_>
    ._M_impl.super__Vector_impl_data._M_finish[-1].name[5] = '_';
    materials.
    super__Vector_base<Assimp::MS3DImporter::TempMaterial,_std::allocator<Assimp::MS3DImporter::TempMaterial>_>
    ._M_impl.super__Vector_impl_data._M_finish[-1].name[6] = 'D';
    materials.
    super__Vector_base<Assimp::MS3DImporter::TempMaterial,_std::allocator<Assimp::MS3DImporter::TempMaterial>_>
    ._M_impl.super__Vector_impl_data._M_finish[-1].name[7] = 'e';
    materials.
    super__Vector_base<Assimp::MS3DImporter::TempMaterial,_std::allocator<Assimp::MS3DImporter::TempMaterial>_>
    ._M_impl.super__Vector_impl_data._M_finish[-1].name[8] = 'f';
    materials.
    super__Vector_base<Assimp::MS3DImporter::TempMaterial,_std::allocator<Assimp::MS3DImporter::TempMaterial>_>
    ._M_impl.super__Vector_impl_data._M_finish[-1].name[9] = 'a';
    materials.
    super__Vector_base<Assimp::MS3DImporter::TempMaterial,_std::allocator<Assimp::MS3DImporter::TempMaterial>_>
    ._M_impl.super__Vector_impl_data._M_finish[-1].name[10] = 'u';
    materials.
    super__Vector_base<Assimp::MS3DImporter::TempMaterial,_std::allocator<Assimp::MS3DImporter::TempMaterial>_>
    ._M_impl.super__Vector_impl_data._M_finish[-1].name[0xb] = 'l';
    materials.
    super__Vector_base<Assimp::MS3DImporter::TempMaterial,_std::allocator<Assimp::MS3DImporter::TempMaterial>_>
    ._M_impl.super__Vector_impl_data._M_finish[-1].name[0xc] = 't';
    materials.
    super__Vector_base<Assimp::MS3DImporter::TempMaterial,_std::allocator<Assimp::MS3DImporter::TempMaterial>_>
    ._M_impl.super__Vector_impl_data._M_finish[-1].name[0xd] = 'M';
    materials.
    super__Vector_base<Assimp::MS3DImporter::TempMaterial,_std::allocator<Assimp::MS3DImporter::TempMaterial>_>
    ._M_impl.super__Vector_impl_data._M_finish[-1].name[0xe] = 'a';
    materials.
    super__Vector_base<Assimp::MS3DImporter::TempMaterial,_std::allocator<Assimp::MS3DImporter::TempMaterial>_>
    ._M_impl.super__Vector_impl_data._M_finish[-1].name[0xf] = 't';
    materials.
    super__Vector_base<Assimp::MS3DImporter::TempMaterial,_std::allocator<Assimp::MS3DImporter::TempMaterial>_>
    ._M_impl.super__Vector_impl_data._M_finish[-1].name[0x10] = '>';
    materials.
    super__Vector_base<Assimp::MS3DImporter::TempMaterial,_std::allocator<Assimp::MS3DImporter::TempMaterial>_>
    ._M_impl.super__Vector_impl_data._M_finish[-1].name[0x11] = '\0';
    materials.
    super__Vector_base<Assimp::MS3DImporter::TempMaterial,_std::allocator<Assimp::MS3DImporter::TempMaterial>_>
    ._M_impl.super__Vector_impl_data._M_finish[-1].diffuse.r = 0.6;
    materials.
    super__Vector_base<Assimp::MS3DImporter::TempMaterial,_std::allocator<Assimp::MS3DImporter::TempMaterial>_>
    ._M_impl.super__Vector_impl_data._M_finish[-1].diffuse.g = 0.6;
    materials.
    super__Vector_base<Assimp::MS3DImporter::TempMaterial,_std::allocator<Assimp::MS3DImporter::TempMaterial>_>
    ._M_impl.super__Vector_impl_data._M_finish[-1].diffuse.b = 0.6;
    materials.
    super__Vector_base<Assimp::MS3DImporter::TempMaterial,_std::allocator<Assimp::MS3DImporter::TempMaterial>_>
    ._M_impl.super__Vector_impl_data._M_finish[-1].diffuse.a = 1.0;
    materials.
    super__Vector_base<Assimp::MS3DImporter::TempMaterial,_std::allocator<Assimp::MS3DImporter::TempMaterial>_>
    ._M_impl.super__Vector_impl_data._M_finish[-1].shininess = 0.0;
    materials.
    super__Vector_base<Assimp::MS3DImporter::TempMaterial,_std::allocator<Assimp::MS3DImporter::TempMaterial>_>
    ._M_impl.super__Vector_impl_data._M_finish[-1].transparency = 1.0;
    materials.
    super__Vector_base<Assimp::MS3DImporter::TempMaterial,_std::allocator<Assimp::MS3DImporter::TempMaterial>_>
    ._M_impl.super__Vector_impl_data._M_finish[-1].alphamap[0] = '\0';
    materials.
    super__Vector_base<Assimp::MS3DImporter::TempMaterial,_std::allocator<Assimp::MS3DImporter::TempMaterial>_>
    ._M_impl.super__Vector_impl_data._M_finish[-1].texture[0] = '\0';
    for (uVar47 = 0; uVar43 = (ulong)uVar47,
        uVar43 < (ulong)(((long)groups.
                                super__Vector_base<Assimp::MS3DImporter::TempGroup,_std::allocator<Assimp::MS3DImporter::TempGroup>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)groups.
                               super__Vector_base<Assimp::MS3DImporter::TempGroup,_std::allocator<Assimp::MS3DImporter::TempGroup>_>
                               ._M_impl.super__Vector_impl_data._M_start) / 0x68);
        uVar47 = uVar47 + 1) {
      if (groups.
          super__Vector_base<Assimp::MS3DImporter::TempGroup,_std::allocator<Assimp::MS3DImporter::TempGroup>_>
          ._M_impl.super__Vector_impl_data._M_start[uVar43].mat == 0xffffffff) {
        groups.
        super__Vector_base<Assimp::MS3DImporter::TempGroup,_std::allocator<Assimp::MS3DImporter::TempGroup>_>
        ._M_impl.super__Vector_impl_data._M_start[uVar43].mat =
             (int)(((long)materials.
                          super__Vector_base<Assimp::MS3DImporter::TempMaterial,_std::allocator<Assimp::MS3DImporter::TempMaterial>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                   (long)materials.
                         super__Vector_base<Assimp::MS3DImporter::TempMaterial,_std::allocator<Assimp::MS3DImporter::TempMaterial>_>
                         ._M_impl.super__Vector_impl_data._M_start) / 400) - 1;
      }
    }
  }
  pTVar39 = materials.
            super__Vector_base<Assimp::MS3DImporter::TempMaterial,_std::allocator<Assimp::MS3DImporter::TempMaterial>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  pTVar48 = materials.
            super__Vector_base<Assimp::MS3DImporter::TempMaterial,_std::allocator<Assimp::MS3DImporter::TempMaterial>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((long)materials.
            super__Vector_base<Assimp::MS3DImporter::TempMaterial,_std::allocator<Assimp::MS3DImporter::TempMaterial>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)materials.
            super__Vector_base<Assimp::MS3DImporter::TempMaterial,_std::allocator<Assimp::MS3DImporter::TempMaterial>_>
            ._M_impl.super__Vector_impl_data._M_start != 0) {
    uVar45 = ((long)materials.
                    super__Vector_base<Assimp::MS3DImporter::TempMaterial,_std::allocator<Assimp::MS3DImporter::TempMaterial>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
             (long)materials.
                   super__Vector_base<Assimp::MS3DImporter::TempMaterial,_std::allocator<Assimp::MS3DImporter::TempMaterial>_>
                   ._M_impl.super__Vector_impl_data._M_start) / 400;
    uVar43 = uVar45 * 8;
    if (0x1fffffffffffffff < uVar45) {
      uVar43 = 0xffffffffffffffff;
    }
    ppaVar17 = (aiMaterial **)operator_new__(uVar43);
    pScene->mMaterials = ppaVar17;
    lVar44 = 0;
    for (uVar43 = 0; uVar43 < (ulong)(((long)pTVar39 - (long)pTVar48) / 400); uVar43 = uVar43 + 1) {
      this_00 = (aiMaterial *)operator_new(0x10);
      aiMaterial::aiMaterial(this_00);
      pTVar48 = materials.
                super__Vector_base<Assimp::MS3DImporter::TempMaterial,_std::allocator<Assimp::MS3DImporter::TempMaterial>_>
                ._M_impl.super__Vector_impl_data._M_start;
      uVar47 = pScene->mNumMaterials;
      pScene->mNumMaterials = uVar47 + 1;
      pScene->mMaterials[uVar47] = this_00;
      tmp._0_8_ = tmp._0_8_ & 0xffffff0000000000;
      memset(tmp.data + 1,0x1b,0x3ff);
      if (pTVar48->alphamap[lVar44] != '\0') {
        std::__cxx11::string::string
                  ((string *)&local_8f0,pTVar48->alphamap + lVar44,(allocator *)&local_888);
        uVar45 = (ulong)(uint)local_8f0.a3;
        if (((uint)local_8f0.a3 & 0xfffffc00) != 0) {
          uVar45 = 0x3ff;
        }
        sm = (ai_uint32)uVar45;
        memcpy(&fStack_434,(void *)CONCAT44(local_8f0.a2,local_8f0.a1),uVar45);
        *(undefined1 *)((long)&fStack_434 + uVar45) = 0;
        tmp.length = (ai_uint32)uVar45;
        memcpy(tmp.data,&fStack_434,uVar45);
        tmp.data[uVar45] = '\0';
        std::__cxx11::string::~string((string *)&local_8f0);
        aiMaterial::AddProperty(this_00,&tmp,"$tex.file",8,0);
      }
      if (pTVar48->texture[lVar44] != '\0') {
        std::__cxx11::string::string
                  ((string *)&local_8f0,pTVar48->texture + lVar44,(allocator *)&local_888);
        uVar45 = (ulong)(uint)local_8f0.a3;
        if (((uint)local_8f0.a3 & 0xfffffc00) != 0) {
          uVar45 = 0x3ff;
        }
        sm = (ai_uint32)uVar45;
        memcpy(&fStack_434,(void *)CONCAT44(local_8f0.a2,local_8f0.a1),uVar45);
        *(undefined1 *)((long)&fStack_434 + uVar45) = 0;
        tmp.length = (ai_uint32)uVar45;
        memcpy(tmp.data,&fStack_434,uVar45);
        tmp.data[uVar45] = '\0';
        std::__cxx11::string::~string((string *)&local_8f0);
        aiMaterial::AddProperty(this_00,&tmp,"$tex.file",1,0);
      }
      if (pTVar48->name[lVar44] != '\0') {
        std::__cxx11::string::string
                  ((string *)&local_8f0,pTVar48->name + lVar44,(allocator *)&local_888);
        uVar45 = (ulong)(uint)local_8f0.a3;
        if (((uint)local_8f0.a3 & 0xfffffc00) != 0) {
          uVar45 = 0x3ff;
        }
        sm = (ai_uint32)uVar45;
        memcpy(&fStack_434,(void *)CONCAT44(local_8f0.a2,local_8f0.a1),uVar45);
        *(undefined1 *)((long)&fStack_434 + uVar45) = 0;
        tmp.length = (ai_uint32)uVar45;
        memcpy(tmp.data,&fStack_434,uVar45);
        tmp.data[uVar45] = '\0';
        std::__cxx11::string::~string((string *)&local_8f0);
        aiMaterial::AddProperty(this_00,&tmp,"?mat.name",0,0);
      }
      aiMaterial::AddProperty
                (this_00,(aiColor4D *)((long)&(pTVar48->ambient).r + lVar44),1,"$clr.ambient",0,0);
      aiMaterial::AddProperty
                (this_00,(aiColor4D *)((long)&(pTVar48->diffuse).r + lVar44),1,"$clr.diffuse",0,0);
      aiMaterial::AddProperty
                (this_00,(aiColor4D *)((long)&(pTVar48->specular).r + lVar44),1,"$clr.specular",0,0)
      ;
      aiMaterial::AddProperty
                (this_00,(aiColor4D *)((long)&(pTVar48->emissive).r + lVar44),1,"$clr.emissive",0,0)
      ;
      pInput = (float *)((long)&pTVar48->shininess + lVar44);
      aiMaterial::AddProperty(this_00,pInput,1,"$mat.shininess",0,0);
      aiMaterial::AddProperty
                (this_00,(float *)((long)&pTVar48->transparency + lVar44),1,"$mat.opacity",0,0);
      sm = 0.0 < *pInput | 2;
      aiMaterial::AddProperty(this_00,&sm,1,"$mat.shadingm",0,0);
      lVar44 = lVar44 + 400;
      pTVar39 = materials.
                super__Vector_base<Assimp::MS3DImporter::TempMaterial,_std::allocator<Assimp::MS3DImporter::TempMaterial>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      pTVar48 = materials.
                super__Vector_base<Assimp::MS3DImporter::TempMaterial,_std::allocator<Assimp::MS3DImporter::TempMaterial>_>
                ._M_impl.super__Vector_impl_data._M_start;
    }
  }
  if (groups.
      super__Vector_base<Assimp::MS3DImporter::TempGroup,_std::allocator<Assimp::MS3DImporter::TempGroup>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      groups.
      super__Vector_base<Assimp::MS3DImporter::TempGroup,_std::allocator<Assimp::MS3DImporter::TempGroup>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    pDVar32 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string
              ((string *)&tmp,"MS3D: Didn\'t get any group records, file is malformed",
               (allocator *)&sm);
    DeadlyImportError::DeadlyImportError(pDVar32,(string *)&tmp);
    __cxa_throw(pDVar32,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  uVar43 = ((long)groups.
                  super__Vector_base<Assimp::MS3DImporter::TempGroup,_std::allocator<Assimp::MS3DImporter::TempGroup>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
           (long)groups.
                 super__Vector_base<Assimp::MS3DImporter::TempGroup,_std::allocator<Assimp::MS3DImporter::TempGroup>_>
                 ._M_impl.super__Vector_impl_data._M_start) / 0x68;
  pScene->mNumMeshes = (uint)uVar43;
  uVar45 = (uVar43 & 0xffffffff) << 3;
  __s = (aiMesh **)operator_new__(uVar45);
  memset(__s,0,uVar45);
  pScene->mMeshes = __s;
  uVar45 = 0;
  while( true ) {
    if ((uint)uVar43 <= (uint)uVar45) {
      this_02 = (aiNode *)operator_new(0x478);
      std::__cxx11::string::string((string *)&tmp,"<MS3DRoot>",(allocator *)&sm);
      aiNode::aiNode(this_02,(string *)&tmp);
      pScene->mRootNode = this_02;
      std::__cxx11::string::~string((string *)&tmp);
      uVar43 = (ulong)pScene->mNumMeshes;
      puVar21 = (uint *)operator_new__(uVar43 * 4);
      this_02->mMeshes = puVar21;
      for (uVar47 = 0; uVar47 < (uint)uVar43; uVar47 = uVar47 + 1) {
        uVar3 = this_02->mNumMeshes;
        this_02->mNumMeshes = uVar3 + 1;
        this_02->mMeshes[uVar3] = uVar47;
        uVar43 = (ulong)pScene->mNumMeshes;
      }
      if (joints.
          super__Vector_base<Assimp::MS3DImporter::TempJoint,_std::allocator<Assimp::MS3DImporter::TempJoint>_>
          ._M_impl.super__Vector_impl_data._M_finish !=
          joints.
          super__Vector_base<Assimp::MS3DImporter::TempJoint,_std::allocator<Assimp::MS3DImporter::TempJoint>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        ppaVar27 = (aiNode **)operator_new__(8);
        *ppaVar27 = (aiNode *)0x0;
        this_02->mChildren = ppaVar27;
        this_02->mNumChildren = 1;
        this_03 = (aiNode *)operator_new(0x478);
        aiNode::aiNode(this_03);
        *this_02->mChildren = this_03;
        this_03->mParent = this_02;
        CollectChildJoints(this,&joints,this_03);
        aiString::Set((aiString *)this_03,"<MS3DJointRoot>");
        pScene->mNumAnimations = 1;
        ppaVar28 = (aiAnimation **)operator_new__(8);
        pScene->mAnimations = ppaVar28;
        this_04 = (aiAnimation *)operator_new(0x448);
        aiAnimation::aiAnimation(this_04);
        *pScene->mAnimations = this_04;
        aiString::Set((aiString *)this_04,"<MS3DMasterAnim>");
        pTVar40 = joints.
                  super__Vector_base<Assimp::MS3DImporter::TempJoint,_std::allocator<Assimp::MS3DImporter::TempJoint>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        this_04->mTicksPerSecond = (double)fVar49;
        uVar45 = ((long)joints.
                        super__Vector_base<Assimp::MS3DImporter::TempJoint,_std::allocator<Assimp::MS3DImporter::TempJoint>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                 (long)joints.
                       super__Vector_base<Assimp::MS3DImporter::TempJoint,_std::allocator<Assimp::MS3DImporter::TempJoint>_>
                       ._M_impl.super__Vector_impl_data._M_start) / 0xb0;
        uVar43 = uVar45 * 8;
        if (0x1fffffffffffffff < uVar45) {
          uVar43 = 0xffffffffffffffff;
        }
        __s_01 = (aiNodeAnim **)operator_new__(uVar43);
        memset(__s_01,0,uVar43);
        this_04->mChannels = __s_01;
        for (sz = joints.
                  super__Vector_base<Assimp::MS3DImporter::TempJoint,_std::allocator<Assimp::MS3DImporter::TempJoint>_>
                  ._M_impl.super__Vector_impl_data._M_start; sz != pTVar40; sz = sz + 1) {
          if (((sz->rotFrames).
               super__Vector_base<Assimp::MS3DImporter::TempKeyFrame,_std::allocator<Assimp::MS3DImporter::TempKeyFrame>_>
               ._M_impl.super__Vector_impl_data._M_start !=
               (sz->rotFrames).
               super__Vector_base<Assimp::MS3DImporter::TempKeyFrame,_std::allocator<Assimp::MS3DImporter::TempKeyFrame>_>
               ._M_impl.super__Vector_impl_data._M_finish) ||
             ((sz->posFrames).
              super__Vector_base<Assimp::MS3DImporter::TempKeyFrame,_std::allocator<Assimp::MS3DImporter::TempKeyFrame>_>
              ._M_impl.super__Vector_impl_data._M_start !=
              (sz->posFrames).
              super__Vector_base<Assimp::MS3DImporter::TempKeyFrame,_std::allocator<Assimp::MS3DImporter::TempKeyFrame>_>
              ._M_impl.super__Vector_impl_data._M_finish)) {
            this_05 = (aiNodeAnim *)operator_new(0x438);
            (this_05->mNodeName).length = 0;
            (this_05->mNodeName).data[0] = '\0';
            memset((this_05->mNodeName).data + 1,0x1b,0x3ff);
            this_05->mRotationKeys = (aiQuatKey *)0x0;
            this_05->mNumScalingKeys = 0;
            *(undefined8 *)&this_05->mNumPositionKeys = 0;
            *(undefined8 *)((long)&this_05->mPositionKeys + 4) = 0;
            this_05->mScalingKeys = (aiVectorKey *)0x0;
            this_05->mPreState = aiAnimBehaviour_DEFAULT;
            this_05->mPostState = aiAnimBehaviour_DEFAULT;
            uVar47 = this_04->mNumChannels;
            this_04->mNumChannels = uVar47 + 1;
            this_04->mChannels[uVar47] = this_05;
            aiString::Set((aiString *)this_05,sz->name);
            lVar44 = (long)(sz->rotFrames).
                           super__Vector_base<Assimp::MS3DImporter::TempKeyFrame,_std::allocator<Assimp::MS3DImporter::TempKeyFrame>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(sz->rotFrames).
                           super__Vector_base<Assimp::MS3DImporter::TempKeyFrame,_std::allocator<Assimp::MS3DImporter::TempKeyFrame>_>
                           ._M_impl.super__Vector_impl_data._M_start;
            if (lVar44 != 0) {
              uVar45 = lVar44 >> 4;
              auVar6._8_8_ = 0;
              auVar6._0_8_ = uVar45;
              uVar43 = SUB168(auVar6 * ZEXT816(0x18),0);
              if (SUB168(auVar6 * ZEXT816(0x18),8) != 0) {
                uVar43 = 0xffffffffffffffff;
              }
              paVar29 = (aiQuatKey *)operator_new__(uVar43);
              paVar37 = paVar29;
              do {
                paVar37->mTime = 0.0;
                (paVar37->mValue).w = 1.0;
                (paVar37->mValue).x = 0.0;
                (paVar37->mValue).y = 0.0;
                (paVar37->mValue).z = 0.0;
                paVar37 = paVar37 + 1;
              } while (paVar37 != paVar29 + uVar45);
              this_05->mRotationKeys = paVar29;
              for (pTVar46 = (sz->rotFrames).
                             super__Vector_base<Assimp::MS3DImporter::TempKeyFrame,_std::allocator<Assimp::MS3DImporter::TempKeyFrame>_>
                             ._M_impl.super__Vector_impl_data._M_start;
                  pTVar46 !=
                  (sz->rotFrames).
                  super__Vector_base<Assimp::MS3DImporter::TempKeyFrame,_std::allocator<Assimp::MS3DImporter::TempKeyFrame>_>
                  ._M_impl.super__Vector_impl_data._M_finish; pTVar46 = pTVar46 + 1) {
                paVar37 = this_05->mRotationKeys;
                uVar47 = this_05->mNumRotationKeys;
                this_05->mNumRotationKeys = uVar47 + 1;
                paVar37[uVar47].mTime = (double)(pTVar46->time * fVar49);
                sm = 0x3f800000;
                fStack_434 = 0.0;
                fStack_430 = 0.0;
                uStack_42c._0_4_ = 0.0;
                uStack_42c._4_4_ = 0.0;
                local_424 = 1.0;
                local_420 = 0.0;
                uStack_41c = 0.0;
                uStack_418._0_4_ = 0.0;
                uStack_418._4_4_ = 0.0;
                local_410 = 1.0;
                local_40c._0_4_ = 0.0;
                local_40c._4_4_ = 0.0;
                uStack_404._0_4_ = 0.0;
                uStack_404._4_4_ = 0.0;
                local_3fc = 1.0;
                paVar30 = aiMatrix4x4t<float>::FromEulerAnglesXYZ
                                    ((aiMatrix4x4t<float> *)&sm,&sz->rotation);
                local_8f0.a1 = 1.0;
                local_8f0.a2 = 0.0;
                local_8f0.a3 = 0.0;
                local_8f0.a4 = 0.0;
                local_8f0.b1 = 0.0;
                local_8f0.b2 = 1.0;
                local_8f0.b3 = 0.0;
                local_8f0.b4 = 0.0;
                local_8f0.c1 = 0.0;
                local_8f0.c2 = 0.0;
                local_8f0.c3 = 1.0;
                local_8f0.c4 = 0.0;
                local_8f0.d1 = 0.0;
                local_8f0.d2 = 0.0;
                local_8f0.d3 = 0.0;
                local_8f0.d4 = 1.0;
                m = aiMatrix4x4t<float>::FromEulerAnglesXYZ(&local_8f0,&pTVar46->value);
                tmp._0_8_ = *(undefined8 *)paVar30;
                tmp.data._4_8_ = *(undefined8 *)&paVar30->a3;
                tmp.data._12_8_ = *(undefined8 *)&paVar30->b1;
                tmp.data._20_8_ = *(undefined8 *)&paVar30->b3;
                tmp.data._28_8_ = *(undefined8 *)&paVar30->c1;
                tmp.data._36_8_ = *(undefined8 *)&paVar30->c3;
                tmp.data._44_8_ = *(undefined8 *)&paVar30->d1;
                tmp.data._52_8_ = *(undefined8 *)&paVar30->d3;
                aiMatrix4x4t<float>::operator*=((aiMatrix4x4t<float> *)&tmp,m);
                local_888.a1 = tmp.length;
                local_888.c1 = tmp.data._28_4_;
                local_888.c2 = tmp.data._32_4_;
                local_888.a2 = (float)tmp.data._0_4_;
                local_888.a3 = (float)tmp.data._4_4_;
                local_888.b1 = (float)tmp.data._12_4_;
                local_888.b2 = (float)tmp.data._16_4_;
                local_888.b3 = (float)tmp.data._20_4_;
                local_888.c3 = (float)tmp.data._36_4_;
                aiQuaterniont<float>::aiQuaterniont(&local_858,&local_888);
                paVar37[uVar47].mValue.w = local_858.w;
                paVar37[uVar47].mValue.x = local_858.x;
                paVar37[uVar47].mValue.y = local_858.y;
                paVar37[uVar47].mValue.z = local_858.z;
              }
            }
            lVar44 = (long)(sz->posFrames).
                           super__Vector_base<Assimp::MS3DImporter::TempKeyFrame,_std::allocator<Assimp::MS3DImporter::TempKeyFrame>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(sz->posFrames).
                           super__Vector_base<Assimp::MS3DImporter::TempKeyFrame,_std::allocator<Assimp::MS3DImporter::TempKeyFrame>_>
                           ._M_impl.super__Vector_impl_data._M_start;
            if (lVar44 != 0) {
              uVar45 = lVar44 >> 4;
              auVar7._8_8_ = 0;
              auVar7._0_8_ = uVar45;
              uVar43 = SUB168(auVar7 * ZEXT816(0x18),0);
              if (SUB168(auVar7 * ZEXT816(0x18),8) != 0) {
                uVar43 = 0xffffffffffffffff;
              }
              paVar31 = (aiVectorKey *)operator_new__(uVar43);
              lVar44 = 0;
              do {
                *(undefined4 *)((long)&(paVar31->mValue).z + lVar44) = 0;
                puVar2 = (undefined8 *)((long)&paVar31->mTime + lVar44);
                *puVar2 = 0;
                puVar2[1] = 0;
                lVar44 = lVar44 + 0x18;
              } while (uVar45 * 0x18 - lVar44 != 0);
              this_05->mPositionKeys = paVar31;
              for (pTVar46 = (sz->posFrames).
                             super__Vector_base<Assimp::MS3DImporter::TempKeyFrame,_std::allocator<Assimp::MS3DImporter::TempKeyFrame>_>
                             ._M_impl.super__Vector_impl_data._M_start;
                  pTVar46 !=
                  (sz->posFrames).
                  super__Vector_base<Assimp::MS3DImporter::TempKeyFrame,_std::allocator<Assimp::MS3DImporter::TempKeyFrame>_>
                  ._M_impl.super__Vector_impl_data._M_finish; pTVar46 = pTVar46 + 1) {
                paVar31 = this_05->mPositionKeys;
                uVar47 = this_05->mNumPositionKeys;
                this_05->mNumPositionKeys = uVar47 + 1;
                paVar31[uVar47].mTime = (double)(pTVar46->time * fVar49);
                aVar51 = ::operator+(&sz->position,&pTVar46->value);
                paVar31[uVar47].mValue.x = (float)(int)aVar51._0_8_;
                paVar31[uVar47].mValue.y = (float)(int)((ulong)aVar51._0_8_ >> 0x20);
                paVar31[uVar47].mValue.z = aVar51.z;
              }
            }
          }
          pTVar40 = joints.
                    super__Vector_base<Assimp::MS3DImporter::TempJoint,_std::allocator<Assimp::MS3DImporter::TempJoint>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        }
        if (this_04->mNumChannels == 0) {
          this_04->mChannels = (aiNodeAnim **)0x0;
        }
      }
      std::vector<Assimp::MS3DImporter::TempJoint,_std::allocator<Assimp::MS3DImporter::TempJoint>_>
      ::~vector(&joints);
      std::
      vector<Assimp::MS3DImporter::TempMaterial,_std::allocator<Assimp::MS3DImporter::TempMaterial>_>
      ::~vector(&materials);
      std::vector<Assimp::MS3DImporter::TempGroup,_std::allocator<Assimp::MS3DImporter::TempGroup>_>
      ::~vector(&groups);
      std::
      _Vector_base<Assimp::MS3DImporter::TempTriangle,_std::allocator<Assimp::MS3DImporter::TempTriangle>_>
      ::~_Vector_base(&triangles.
                       super__Vector_base<Assimp::MS3DImporter::TempTriangle,_std::allocator<Assimp::MS3DImporter::TempTriangle>_>
                     );
      std::
      _Vector_base<Assimp::MS3DImporter::TempVertex,_std::allocator<Assimp::MS3DImporter::TempVertex>_>
      ::~_Vector_base(&vertices.
                       super__Vector_base<Assimp::MS3DImporter::TempVertex,_std::allocator<Assimp::MS3DImporter::TempVertex>_>
                     );
      StreamReader<false,_false>::~StreamReader(&stream);
      return;
    }
    this_01 = (aiMesh *)operator_new(0x520);
    aiMesh::aiMesh(this_01);
    pTVar41 = groups.
              super__Vector_base<Assimp::MS3DImporter::TempGroup,_std::allocator<Assimp::MS3DImporter::TempGroup>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pScene->mMeshes[uVar45] = this_01;
    if ((pScene->mNumMaterials != 0) &&
       (pScene->mNumMaterials <
        groups.
        super__Vector_base<Assimp::MS3DImporter::TempGroup,_std::allocator<Assimp::MS3DImporter::TempGroup>_>
        ._M_impl.super__Vector_impl_data._M_start[uVar45].mat)) break;
    this_01->mMaterialIndex =
         groups.
         super__Vector_base<Assimp::MS3DImporter::TempGroup,_std::allocator<Assimp::MS3DImporter::TempGroup>_>
         ._M_impl.super__Vector_impl_data._M_start[uVar45].mat;
    this_01->mPrimitiveTypes = 4;
    uVar43 = (long)groups.
                   super__Vector_base<Assimp::MS3DImporter::TempGroup,_std::allocator<Assimp::MS3DImporter::TempGroup>_>
                   ._M_impl.super__Vector_impl_data._M_start[uVar45].triangles.
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)groups.
                   super__Vector_base<Assimp::MS3DImporter::TempGroup,_std::allocator<Assimp::MS3DImporter::TempGroup>_>
                   ._M_impl.super__Vector_impl_data._M_start[uVar45].triangles.
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_start >> 2;
    uVar47 = (uint)uVar43;
    this_01->mNumFaces = uVar47;
    uVar38 = uVar43 & 0xffffffff;
    puVar18 = (ulong *)operator_new__(uVar38 * 0x10 + 8);
    *puVar18 = uVar38;
    paVar19 = (aiFace *)(puVar18 + 1);
    if (uVar38 != 0) {
      paVar34 = paVar19;
      do {
        paVar34->mNumIndices = 0;
        paVar34->mIndices = (uint *)0x0;
        paVar34 = paVar34 + 1;
      } while (paVar34 != paVar19 + uVar38);
    }
    this_01->mFaces = paVar19;
    this_01->mNumVertices = uVar47 * 3;
    uVar38 = (ulong)(uVar47 * 3) * 0xc;
    paVar20 = (aiVector3D *)operator_new__(uVar38);
    if (uVar47 != 0) {
      memset(paVar20,0,((uVar38 - 0xc) - (uVar38 - 0xc) % 0xc) + 0xc);
    }
    this_01->mVertices = paVar20;
    paVar20 = (aiVector3D *)operator_new__(uVar38);
    if (uVar47 != 0) {
      memset(paVar20,0,((uVar38 - 0xc) - (uVar38 - 0xc) % 0xc) + 0xc);
    }
    this_01->mNormals = paVar20;
    paVar20 = (aiVector3D *)operator_new__(uVar38);
    if (uVar47 != 0) {
      memset(paVar20,0,((uVar38 - 0xc) - (uVar38 - 0xc) % 0xc) + 0xc);
    }
    tmp.data._4_8_ = tmp.data._4_8_ & 0xffffffff00000000;
    tmp.data[0xc] = '\0';
    tmp.data[0xd] = '\0';
    tmp.data[0xe] = '\0';
    tmp.data[0xf] = '\0';
    tmp.data[0x10] = '\0';
    tmp.data[0x11] = '\0';
    tmp.data[0x12] = '\0';
    tmp.data[0x13] = '\0';
    tmp.data._20_8_ = tmp.data + 4;
    tmp.data[0x24] = '\0';
    tmp.data[0x25] = '\0';
    tmp.data[0x26] = '\0';
    tmp.data[0x27] = '\0';
    tmp.data[0x28] = '\0';
    tmp.data[0x29] = '\0';
    tmp.data[0x2a] = '\0';
    tmp.data[0x2b] = '\0';
    this_01->mTextureCoords[0] = paVar20;
    this_01->mNumUVComponents[0] = 2;
    uVar47 = 0;
    tmp.data._28_8_ = tmp.data._20_8_;
    for (uVar38 = 0;
        pTVar9 = triangles.
                 super__Vector_base<Assimp::MS3DImporter::TempTriangle,_std::allocator<Assimp::MS3DImporter::TempTriangle>_>
                 ._M_impl.super__Vector_impl_data._M_start, (uint)uVar38 < (uint)uVar43;
        uVar38 = (ulong)((uint)uVar38 + 1)) {
      uVar43 = (ulong)pTVar41[uVar45].triangles.
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_start[uVar38];
      if ((ulong)(((long)triangles.
                         super__Vector_base<Assimp::MS3DImporter::TempTriangle,_std::allocator<Assimp::MS3DImporter::TempTriangle>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                  (long)triangles.
                        super__Vector_base<Assimp::MS3DImporter::TempTriangle,_std::allocator<Assimp::MS3DImporter::TempTriangle>_>
                        ._M_impl.super__Vector_impl_data._M_start) / 0x50) < uVar43) {
        pDVar32 = (DeadlyImportError *)
                  __cxa_allocate_exception
                            (0x10,uVar38,
                             ((long)triangles.
                                    super__Vector_base<Assimp::MS3DImporter::TempTriangle,_std::allocator<Assimp::MS3DImporter::TempTriangle>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                             (long)triangles.
                                   super__Vector_base<Assimp::MS3DImporter::TempTriangle,_std::allocator<Assimp::MS3DImporter::TempTriangle>_>
                                   ._M_impl.super__Vector_impl_data._M_start) % 0x50);
        std::__cxx11::string::string
                  ((string *)&sm,"MS3D: Encountered invalid triangle index, file is malformed",
                   (allocator *)&local_8f0);
        DeadlyImportError::DeadlyImportError(pDVar32,(string *)&sm);
        __cxa_throw(pDVar32,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
      }
      paVar19 = this_01->mFaces + uVar38;
      paVar19->mNumIndices = 3;
      puVar21 = (uint *)operator_new__(0xc);
      paVar19->mIndices = puVar21;
      for (lVar44 = 0;
          pTVar8 = vertices.
                   super__Vector_base<Assimp::MS3DImporter::TempVertex,_std::allocator<Assimp::MS3DImporter::TempVertex>_>
                   ._M_impl.super__Vector_impl_data._M_start, lVar44 != 3; lVar44 = lVar44 + 1) {
        uVar35 = (ulong)pTVar9[uVar43].indices[lVar44];
        if ((ulong)(((long)vertices.
                           super__Vector_base<Assimp::MS3DImporter::TempVertex,_std::allocator<Assimp::MS3DImporter::TempVertex>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)vertices.
                          super__Vector_base<Assimp::MS3DImporter::TempVertex,_std::allocator<Assimp::MS3DImporter::TempVertex>_>
                          ._M_impl.super__Vector_impl_data._M_start) / 0x30) < uVar35) {
          pDVar32 = (DeadlyImportError *)
                    __cxa_allocate_exception
                              (0x10,vertices.
                                    super__Vector_base<Assimp::MS3DImporter::TempVertex,_std::allocator<Assimp::MS3DImporter::TempVertex>_>
                                    ._M_impl.super__Vector_impl_data._M_start,
                               ((long)vertices.
                                      super__Vector_base<Assimp::MS3DImporter::TempVertex,_std::allocator<Assimp::MS3DImporter::TempVertex>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                               (long)vertices.
                                     super__Vector_base<Assimp::MS3DImporter::TempVertex,_std::allocator<Assimp::MS3DImporter::TempVertex>_>
                                     ._M_impl.super__Vector_impl_data._M_start) % 0x30);
          std::__cxx11::string::string
                    ((string *)&sm,"MS3D: Encountered invalid vertex index, file is malformed",
                     (allocator *)&local_8f0);
          DeadlyImportError::DeadlyImportError(pDVar32,(string *)&sm);
          __cxa_throw(pDVar32,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
        }
        pTVar1 = vertices.
                 super__Vector_base<Assimp::MS3DImporter::TempVertex,_std::allocator<Assimp::MS3DImporter::TempVertex>_>
                 ._M_impl.super__Vector_impl_data._M_start + uVar35;
        for (lVar42 = 0; lVar42 != 0x10; lVar42 = lVar42 + 4) {
          uVar36 = (ulong)*(uint *)((long)pTVar8[uVar35].bone_id + lVar42);
          if (uVar36 != 0xffffffff) {
            if ((ulong)(((long)joints.
                               super__Vector_base<Assimp::MS3DImporter::TempJoint,_std::allocator<Assimp::MS3DImporter::TempJoint>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)joints.
                              super__Vector_base<Assimp::MS3DImporter::TempJoint,_std::allocator<Assimp::MS3DImporter::TempJoint>_>
                              ._M_impl.super__Vector_impl_data._M_start) / 0xb0) <= uVar36) {
              pDVar32 = (DeadlyImportError *)
                        __cxa_allocate_exception
                                  (0x10,0xb0,
                                   ((long)joints.
                                          super__Vector_base<Assimp::MS3DImporter::TempJoint,_std::allocator<Assimp::MS3DImporter::TempJoint>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)joints.
                                         super__Vector_base<Assimp::MS3DImporter::TempJoint,_std::allocator<Assimp::MS3DImporter::TempJoint>_>
                                         ._M_impl.super__Vector_impl_data._M_start) % 0xb0);
              std::__cxx11::string::string
                        ((string *)&sm,"MS3D: Encountered invalid bone index, file is malformed",
                         (allocator *)&local_8f0);
              DeadlyImportError::DeadlyImportError(pDVar32,(string *)&sm);
              __cxa_throw(pDVar32,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
            }
            __k = (key_type *)((long)pTVar8[uVar35].bone_id + lVar42);
            iVar22 = std::
                     _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::_Select1st<std::pair<const_unsigned_int,_unsigned_int>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                     ::find((_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::_Select1st<std::pair<const_unsigned_int,_unsigned_int>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                             *)&tmp,__k);
            if (iVar22._M_node == (_Base_ptr)(tmp.data + 4)) {
              pmVar23 = std::
                        map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                        ::operator[]((map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                                      *)&tmp,__k);
              *pmVar23 = 1;
            }
            else {
              pmVar23 = std::
                        map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                        ::operator[]((map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                                      *)&tmp,__k);
              *pmVar23 = *pmVar23 + 1;
            }
          }
        }
        paVar20 = this_01->mVertices;
        paVar20[uVar47].z = (pTVar1->pos).z;
        fVar50 = (pTVar1->pos).y;
        paVar20 = paVar20 + uVar47;
        paVar20->x = (pTVar1->pos).x;
        paVar20->y = fVar50;
        paVar20 = this_01->mNormals;
        paVar20[uVar47].z = pTVar9[uVar43].normals[lVar44].z;
        fVar50 = pTVar9[uVar43].normals[lVar44].y;
        paVar20 = paVar20 + uVar47;
        paVar20->x = pTVar9[uVar43].normals[lVar44].x;
        paVar20->y = fVar50;
        fVar50 = pTVar9[uVar43].uv[lVar44].y;
        paVar20 = this_01->mTextureCoords[0];
        paVar20[uVar47].x = pTVar9[uVar43].uv[lVar44].x;
        paVar20[uVar47].y = 1.0 - fVar50;
        paVar20[uVar47].z = 0.0;
        paVar19->mIndices[lVar44] = uVar47;
        uVar47 = uVar47 + 1;
      }
      uVar43 = (ulong)this_01->mNumFaces;
    }
    if (tmp.data._36_8_ != 0) {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&sm,
                 ((long)joints.
                        super__Vector_base<Assimp::MS3DImporter::TempJoint,_std::allocator<Assimp::MS3DImporter::TempJoint>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                 (long)joints.
                       super__Vector_base<Assimp::MS3DImporter::TempJoint,_std::allocator<Assimp::MS3DImporter::TempJoint>_>
                       ._M_impl.super__Vector_impl_data._M_start) / 0xb0,
                 (allocator_type *)&local_8f0);
      uVar43 = tmp.data._36_8_ * 8;
      if (0x1fffffffffffffff < (ulong)tmp.data._36_8_) {
        uVar43 = 0xffffffffffffffff;
      }
      __s_00 = (aiBone **)operator_new__(uVar43);
      memset(__s_00,0,uVar43);
      this_01->mBones = __s_00;
      for (p_Var26 = (_Rb_tree_node_base *)tmp.data._20_8_;
          p_Var26 != (_Rb_tree_node_base *)(tmp.data + 4);
          p_Var26 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var26)) {
        paVar24 = (aiBone *)operator_new(0x450);
        aiBone::aiBone(paVar24);
        this_01->mBones[this_01->mNumBones] = paVar24;
        aiString::Set((aiString *)paVar24,
                      joints.
                      super__Vector_base<Assimp::MS3DImporter::TempJoint,_std::allocator<Assimp::MS3DImporter::TempJoint>_>
                      ._M_impl.super__Vector_impl_data._M_start[p_Var26[1]._M_color].name);
        uVar47 = *(uint *)&p_Var26[1].field_0x4;
        uVar43 = (ulong)uVar47 * 8;
        paVar25 = (aiVertexWeight *)operator_new__(uVar43);
        if (uVar47 != 0) {
          memset(paVar25,0,uVar43);
        }
        paVar24->mWeights = paVar25;
        uVar47 = this_01->mNumBones;
        this_01->mNumBones = uVar47 + 1;
        *(uint *)(CONCAT44(fStack_434,sm) + (ulong)p_Var26[1]._M_color * 4) = uVar47;
      }
      uVar47 = 0;
      for (uVar43 = 0; uVar43 < this_01->mNumFaces; uVar43 = uVar43 + 1) {
        uVar3 = pTVar41[uVar45].triangles.
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start[uVar43];
        for (lVar44 = 0; lVar44 != 3; lVar44 = lVar44 + 1) {
          uVar4 = triangles.
                  super__Vector_base<Assimp::MS3DImporter::TempTriangle,_std::allocator<Assimp::MS3DImporter::TempTriangle>_>
                  ._M_impl.super__Vector_impl_data._M_start[uVar3].indices[lVar44];
          for (lVar42 = -0x10; lVar42 != 0; lVar42 = lVar42 + 4) {
            uVar38 = (ulong)*(uint *)((long)vertices.
                                            super__Vector_base<Assimp::MS3DImporter::TempVertex,_std::allocator<Assimp::MS3DImporter::TempVertex>_>
                                            ._M_impl.super__Vector_impl_data._M_start[uVar4].weights
                                     + lVar42 + -4);
            if (uVar38 != 0xffffffff) {
              paVar24 = this_01->mBones[*(uint *)(CONCAT44(fStack_434,sm) + uVar38 * 4)];
              paVar25 = paVar24->mWeights;
              uVar5 = paVar24->mNumWeights;
              paVar24->mNumWeights = uVar5 + 1;
              paVar25[uVar5].mVertexId = uVar47;
              paVar25[uVar5].mWeight =
                   *(float *)((long)vertices.
                                    super__Vector_base<Assimp::MS3DImporter::TempVertex,_std::allocator<Assimp::MS3DImporter::TempVertex>_>
                                    ._M_impl.super__Vector_impl_data._M_start[(ulong)uVar4 + 1].
                                    bone_id + lVar42 + -0xc);
            }
          }
          uVar47 = uVar47 + 1;
        }
      }
      std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&sm);
    }
    std::
    _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::_Select1st<std::pair<const_unsigned_int,_unsigned_int>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
    ::~_Rb_tree((_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::_Select1st<std::pair<const_unsigned_int,_unsigned_int>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                 *)&tmp);
    uVar45 = (ulong)((uint)uVar45 + 1);
    uVar43 = (ulong)pScene->mNumMeshes;
  }
  pDVar32 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string
            ((string *)&tmp,"MS3D: Encountered invalid material index, file is malformed",
             (allocator *)&sm);
  DeadlyImportError::DeadlyImportError(pDVar32,(string *)&tmp);
  __cxa_throw(pDVar32,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void MS3DImporter::InternReadFile( const std::string& pFile,
    aiScene* pScene, IOSystem* pIOHandler)
{
    StreamReaderLE stream(pIOHandler->Open(pFile,"rb"));

    // CanRead() should have done this already
    char head[10];
    int32_t version;

    mScene = pScene;


    // 1 ------------ read into temporary data structures mirroring the original file

    stream.CopyAndAdvance(head,10);
    stream >> version;
    if (strncmp(head,"MS3D000000",10)) {
        throw DeadlyImportError("Not a MS3D file, magic string MS3D000000 not found: "+pFile);
    }

    if (version != 4) {
        throw DeadlyImportError("MS3D: Unsupported file format version, 4 was expected");
    }

    uint16_t verts;
    stream >> verts;

    std::vector<TempVertex> vertices(verts);
    for (unsigned int i = 0; i < verts; ++i) {
        TempVertex& v = vertices[i];

        stream.IncPtr(1);
        ReadVector(stream,v.pos);
        v.bone_id[0] = stream.GetI1();
        v.ref_cnt = stream.GetI1();

        v.bone_id[1] = v.bone_id[2] = v.bone_id[3] = UINT_MAX;
        v.weights[1] = v.weights[2] = v.weights[3] = 0.f;
        v.weights[0] = 1.f;
    }

    uint16_t tris;
    stream >> tris;

    std::vector<TempTriangle> triangles(tris);
    for (unsigned int i = 0;i < tris; ++i) {
        TempTriangle& t = triangles[i];

        stream.IncPtr(2);
        for (unsigned int i = 0; i < 3; ++i) {
            t.indices[i] = stream.GetI2();
        }

        for (unsigned int i = 0; i < 3; ++i) {
            ReadVector(stream,t.normals[i]);
        }

        for (unsigned int i = 0; i < 3; ++i) {
            stream >> (float&)(t.uv[i].x); // see note in ReadColor()
        }
        for (unsigned int i = 0; i < 3; ++i) {
            stream >> (float&)(t.uv[i].y);
        }

        t.sg    = stream.GetI1();
        t.group = stream.GetI1();
    }

    uint16_t grp;
    stream >> grp;

    bool need_default = false;
    std::vector<TempGroup> groups(grp);
    for (unsigned int i = 0;i < grp; ++i) {
        TempGroup& t = groups[i];

        stream.IncPtr(1);
        stream.CopyAndAdvance(t.name,32);

        t.name[32] = '\0';
        uint16_t num;
        stream >> num;

        t.triangles.resize(num);
        for (unsigned int i = 0; i < num; ++i) {
            t.triangles[i] = stream.GetI2();
        }
        t.mat = stream.GetI1();
        if (t.mat == UINT_MAX) {
            need_default = true;
        }
    }

    uint16_t mat;
    stream >> mat;

    std::vector<TempMaterial> materials(mat);
    for (unsigned int i = 0;i < mat; ++i) {
        TempMaterial& t = materials[i];

        stream.CopyAndAdvance(t.name,32);
        t.name[32] = '\0';

        ReadColor(stream,t.ambient);
        ReadColor(stream,t.diffuse);
        ReadColor(stream,t.specular);
        ReadColor(stream,t.emissive);
        stream >> t.shininess  >> t.transparency;

        stream.IncPtr(1);

        stream.CopyAndAdvance(t.texture,128);
        t.texture[128] = '\0';

        stream.CopyAndAdvance(t.alphamap,128);
        t.alphamap[128] = '\0';
    }

    float animfps, currenttime;
    uint32_t totalframes;
    stream >> animfps >> currenttime >> totalframes;

    uint16_t joint;
    stream >> joint;

    std::vector<TempJoint> joints(joint);
    for(unsigned int i = 0; i < joint; ++i) {
        TempJoint& j = joints[i];

        stream.IncPtr(1);
        stream.CopyAndAdvance(j.name,32);
        j.name[32] = '\0';

        stream.CopyAndAdvance(j.parentName,32);
        j.parentName[32] = '\0';

        ReadVector(stream,j.rotation);
        ReadVector(stream,j.position);

        j.rotFrames.resize(stream.GetI2());
        j.posFrames.resize(stream.GetI2());

        for(unsigned int a = 0; a < j.rotFrames.size(); ++a) {
            TempKeyFrame& kf = j.rotFrames[a];
            stream >> kf.time;
            ReadVector(stream,kf.value);
        }
        for(unsigned int a = 0; a < j.posFrames.size(); ++a) {
            TempKeyFrame& kf = j.posFrames[a];
            stream >> kf.time;
            ReadVector(stream,kf.value);
        }
    }

    if(stream.GetRemainingSize() > 4) {
        uint32_t subversion;
        stream >> subversion;
        if (subversion == 1) {
            ReadComments<TempGroup>(stream,groups);
            ReadComments<TempMaterial>(stream,materials);
            ReadComments<TempJoint>(stream,joints);

            // model comment - print it for we have such a nice log.
            if (stream.GetI4()) {
                const size_t len = static_cast<size_t>(stream.GetI4());
                if (len > stream.GetRemainingSize()) {
                    throw DeadlyImportError("MS3D: Model comment is too long");
                }

                const std::string& s = std::string(reinterpret_cast<char*>(stream.GetPtr()),len);
                ASSIMP_LOG_DEBUG_F("MS3D: Model comment: ", s);
            }

            if(stream.GetRemainingSize() > 4 && inrange((stream >> subversion,subversion),1u,3u)) {
                for(unsigned int i = 0; i < verts; ++i) {
                    TempVertex& v = vertices[i];
                    v.weights[3]=1.f;
                    for(unsigned int n = 0; n < 3; v.weights[3]-=v.weights[n++]) {
                        v.bone_id[n+1] = stream.GetI1();
                        v.weights[n] = static_cast<float>(static_cast<unsigned int>(stream.GetI1()))/255.f;
                    }
                    stream.IncPtr((subversion-1)<<2u);
                }

                // even further extra data is not of interest for us, at least now now.
            }
        }
    }

    // 2 ------------ convert to proper aiXX data structures -----------------------------------

    if (need_default && materials.size()) {
        ASSIMP_LOG_WARN("MS3D: Found group with no material assigned, spawning default material");
        // if one of the groups has no material assigned, but there are other
        // groups with materials, a default material needs to be added (
        // scenepreprocessor adds a default material only if nummat==0).
        materials.push_back(TempMaterial());
        TempMaterial& m = materials.back();

        strcpy(m.name,"<MS3D_DefaultMat>");
        m.diffuse = aiColor4D(0.6f,0.6f,0.6f,1.0);
        m.transparency = 1.f;
        m.shininess = 0.f;

        // this is because these TempXXX struct's have no c'tors.
        m.texture[0] = m.alphamap[0] = '\0';

        for (unsigned int i = 0; i < groups.size(); ++i) {
            TempGroup& g = groups[i];
            if (g.mat == UINT_MAX) {
                g.mat = static_cast<unsigned int>(materials.size()-1);
            }
        }
    }

    // convert materials to our generic key-value dict-alike
    if (materials.size()) {
        pScene->mMaterials = new aiMaterial*[materials.size()];
        for (size_t i = 0; i < materials.size(); ++i) {

            aiMaterial* mo = new aiMaterial();
            pScene->mMaterials[pScene->mNumMaterials++] = mo;

            const TempMaterial& mi = materials[i];

            aiString tmp;
            if (0[mi.alphamap]) {
                tmp = aiString(mi.alphamap);
                mo->AddProperty(&tmp,AI_MATKEY_TEXTURE_OPACITY(0));
            }
            if (0[mi.texture]) {
                tmp = aiString(mi.texture);
                mo->AddProperty(&tmp,AI_MATKEY_TEXTURE_DIFFUSE(0));
            }
            if (0[mi.name]) {
                tmp = aiString(mi.name);
                mo->AddProperty(&tmp,AI_MATKEY_NAME);
            }

            mo->AddProperty(&mi.ambient,1,AI_MATKEY_COLOR_AMBIENT);
            mo->AddProperty(&mi.diffuse,1,AI_MATKEY_COLOR_DIFFUSE);
            mo->AddProperty(&mi.specular,1,AI_MATKEY_COLOR_SPECULAR);
            mo->AddProperty(&mi.emissive,1,AI_MATKEY_COLOR_EMISSIVE);

            mo->AddProperty(&mi.shininess,1,AI_MATKEY_SHININESS);
            mo->AddProperty(&mi.transparency,1,AI_MATKEY_OPACITY);

            const int sm = mi.shininess>0.f?aiShadingMode_Phong:aiShadingMode_Gouraud;
            mo->AddProperty(&sm,1,AI_MATKEY_SHADING_MODEL);
        }
    }

    // convert groups to meshes
    if (groups.empty()) {
        throw DeadlyImportError("MS3D: Didn't get any group records, file is malformed");
    }

    pScene->mMeshes = new aiMesh*[pScene->mNumMeshes=static_cast<unsigned int>(groups.size())]();
    for (unsigned int i = 0; i < pScene->mNumMeshes; ++i) {

        aiMesh* m = pScene->mMeshes[i] = new aiMesh();
        const TempGroup& g = groups[i];

        if (pScene->mNumMaterials && g.mat > pScene->mNumMaterials) {
            throw DeadlyImportError("MS3D: Encountered invalid material index, file is malformed");
        } // no error if no materials at all - scenepreprocessor adds one then

        m->mMaterialIndex  = g.mat;
        m->mPrimitiveTypes = aiPrimitiveType_TRIANGLE;

        m->mFaces = new aiFace[m->mNumFaces = static_cast<unsigned int>(g.triangles.size())];
        m->mNumVertices = m->mNumFaces*3;

        // storage for vertices - verbose format, as requested by the postprocessing pipeline
        m->mVertices = new aiVector3D[m->mNumVertices];
        m->mNormals  = new aiVector3D[m->mNumVertices];
        m->mTextureCoords[0] = new aiVector3D[m->mNumVertices];
        m->mNumUVComponents[0] = 2;

        typedef std::map<unsigned int,unsigned int> BoneSet;
        BoneSet mybones;

        for (unsigned int i = 0,n = 0; i < m->mNumFaces; ++i) {
            aiFace& f = m->mFaces[i];
            if (g.triangles[i]>triangles.size()) {
                throw DeadlyImportError("MS3D: Encountered invalid triangle index, file is malformed");
            }

            TempTriangle& t = triangles[g.triangles[i]];
            f.mIndices = new unsigned int[f.mNumIndices=3];

            for (unsigned int i = 0; i < 3; ++i,++n) {
                if (t.indices[i]>vertices.size()) {
                    throw DeadlyImportError("MS3D: Encountered invalid vertex index, file is malformed");
                }

                const TempVertex& v = vertices[t.indices[i]];
                for(unsigned int a = 0; a < 4; ++a) {
                    if (v.bone_id[a] != UINT_MAX) {
                        if (v.bone_id[a] >= joints.size()) {
                            throw DeadlyImportError("MS3D: Encountered invalid bone index, file is malformed");
                        }
                        if (mybones.find(v.bone_id[a]) == mybones.end()) {
                             mybones[v.bone_id[a]] = 1;
                        }
                        else ++mybones[v.bone_id[a]];
                    }
                }

                // collect vertex components
                m->mVertices[n] = v.pos;

                m->mNormals[n] = t.normals[i];
                m->mTextureCoords[0][n] = aiVector3D(t.uv[i].x,1.f-t.uv[i].y,0.0);
                f.mIndices[i] = n;
            }
        }

        // allocate storage for bones
        if(!mybones.empty()) {
            std::vector<unsigned int> bmap(joints.size());
            m->mBones = new aiBone*[mybones.size()]();
            for(BoneSet::const_iterator it = mybones.begin(); it != mybones.end(); ++it) {
                aiBone* const bn = m->mBones[m->mNumBones] = new aiBone();
                const TempJoint& jnt = joints[(*it).first];

                bn->mName.Set(jnt.name);
                bn->mWeights = new aiVertexWeight[(*it).second];

                bmap[(*it).first] = m->mNumBones++;
            }

            // .. and collect bone weights
            for (unsigned int i = 0,n = 0; i < m->mNumFaces; ++i) {
                TempTriangle& t = triangles[g.triangles[i]];

                for (unsigned int i = 0; i < 3; ++i,++n) {
                    const TempVertex& v = vertices[t.indices[i]];
                    for(unsigned int a = 0; a < 4; ++a) {
                        const unsigned int bone = v.bone_id[a];
                        if(bone==UINT_MAX){
                            continue;
                        }

                        aiBone* const outbone = m->mBones[bmap[bone]];
                        aiVertexWeight& outwght = outbone->mWeights[outbone->mNumWeights++];

                        outwght.mVertexId = n;
                        outwght.mWeight = v.weights[a];
                    }
                }
            }
        }
    }

    // ... add dummy nodes under a single root, each holding a reference to one
    // mesh. If we didn't do this, we'd lose the group name.
    aiNode* rt = pScene->mRootNode = new aiNode("<MS3DRoot>");

#ifdef ASSIMP_BUILD_MS3D_ONE_NODE_PER_MESH
    rt->mChildren = new aiNode*[rt->mNumChildren=pScene->mNumMeshes+(joints.size()?1:0)]();

    for (unsigned int i = 0; i < pScene->mNumMeshes; ++i) {
        aiNode* nd = rt->mChildren[i] = new aiNode();

        const TempGroup& g = groups[i];

        // we need to generate an unique name for all mesh nodes.
        // since we want to keep the group name, a prefix is
        // prepended.
        nd->mName = aiString("<MS3DMesh>_");
        nd->mName.Append(g.name);
        nd->mParent = rt;

        nd->mMeshes = new unsigned int[nd->mNumMeshes = 1];
        nd->mMeshes[0] = i;
    }
#else
    rt->mMeshes = new unsigned int[pScene->mNumMeshes];
    for (unsigned int i = 0; i < pScene->mNumMeshes; ++i) {
        rt->mMeshes[rt->mNumMeshes++] = i;
    }
#endif

    // convert animations as well
    if(joints.size()) {
#ifndef ASSIMP_BUILD_MS3D_ONE_NODE_PER_MESH
        rt->mChildren = new aiNode*[1]();
        rt->mNumChildren = 1;

        aiNode* jt = rt->mChildren[0] = new aiNode();
#else
        aiNode* jt = rt->mChildren[pScene->mNumMeshes] = new aiNode();
#endif
        jt->mParent = rt;
        CollectChildJoints(joints,jt);
        jt->mName.Set("<MS3DJointRoot>");

        pScene->mAnimations = new aiAnimation*[ pScene->mNumAnimations = 1 ];
        aiAnimation* const anim = pScene->mAnimations[0] = new aiAnimation();

        anim->mName.Set("<MS3DMasterAnim>");

        // carry the fps info to the user by scaling all times with it
        anim->mTicksPerSecond = animfps;

        // leave duration at its default, so ScenePreprocessor will fill an appropriate
        // value (the values taken from some MS3D files seem to be too unreliable
        // to pass the validation)
        // anim->mDuration = totalframes/animfps;

        anim->mChannels = new aiNodeAnim*[joints.size()]();
        for(std::vector<TempJoint>::const_iterator it = joints.begin(); it != joints.end(); ++it) {
            if ((*it).rotFrames.empty() && (*it).posFrames.empty()) {
                continue;
            }

            aiNodeAnim* nd = anim->mChannels[anim->mNumChannels++] = new aiNodeAnim();
            nd->mNodeName.Set((*it).name);

            if ((*it).rotFrames.size()) {
                nd->mRotationKeys = new aiQuatKey[(*it).rotFrames.size()];
                for(std::vector<TempKeyFrame>::const_iterator rot = (*it).rotFrames.begin(); rot != (*it).rotFrames.end(); ++rot) {
                    aiQuatKey& q = nd->mRotationKeys[nd->mNumRotationKeys++];

                    q.mTime = (*rot).time*animfps;
                    q.mValue = aiQuaternion(aiMatrix3x3(aiMatrix4x4().FromEulerAnglesXYZ((*it).rotation)*
                        aiMatrix4x4().FromEulerAnglesXYZ((*rot).value)));
                }
            }

            if ((*it).posFrames.size()) {
                nd->mPositionKeys = new aiVectorKey[(*it).posFrames.size()];

                aiQuatKey* qu = nd->mRotationKeys;
                for(std::vector<TempKeyFrame>::const_iterator pos = (*it).posFrames.begin(); pos != (*it).posFrames.end(); ++pos,++qu) {
                    aiVectorKey& v = nd->mPositionKeys[nd->mNumPositionKeys++];

                    v.mTime = (*pos).time*animfps;
                    v.mValue = (*it).position + (*pos).value;
                }
            }
        }
        // fixup to pass the validation if not a single animation channel is non-trivial
        if (!anim->mNumChannels) {
            anim->mChannels = NULL;
        }
    }
}